

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O1

void __thiscall ClassBundle::updateField(ClassBundle *this,Field *field)

{
  FieldType type;
  string local_70;
  FieldType local_50;
  
  FieldType::FieldType(&local_50,&field->type);
  updateFieldType(this,&local_50);
  FieldType::getName_abi_cxx11_(&local_70,&local_50);
  std::__cxx11::string::operator=((string *)field,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::vector<FieldType,_std::allocator<FieldType>_>::~vector(&local_50.templateTypes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
    operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void updateField(Field &field) {
        FieldType type(field.type);
//        type.Debug();

        this->updateFieldType(type);

        field.type = type.getName();
    }